

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexttable.cpp
# Opt level: O3

void __thiscall QTextTablePrivate::update(QTextTablePrivate *this)

{
  int iVar1;
  QTextDocumentPrivate *pQVar2;
  pointer piVar3;
  pointer piVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  pointer piVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  undefined1 local_58 [16];
  value_type_conflict4 local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QTextTable::format((QTextTable *)&stack0xffffffffffffffb8);
  iVar5 = QTextFormat::intProperty((QTextFormat *)&stack0xffffffffffffffb8,0x4100);
  this->nCols = iVar5 + (uint)(iVar5 == 0);
  QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
  lVar11 = (long)this->nCols;
  iVar5 = (int)(((this->cells).d.size + lVar11 + -1) / lVar11);
  this->nRows = iVar5;
  local_48 = 0;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->grid,iVar5 * lVar11,&stack0xffffffffffffffb8);
  pQVar2 = (this->super_QTextFramePrivate).super_QTextObjectPrivate.pieceTable;
  QList<int>::resize(&this->cellIndices,(this->cells).d.size);
  if ((this->cells).d.size != 0) {
    uVar16 = 0;
    uVar17 = 0;
    do {
      iVar5 = (this->cells).d.ptr[uVar16];
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormatCollection::format
                ((QTextFormatCollection *)&stack0xffffffffffffffb8,(int)pQVar2 + 0xe8);
      QTextFormat::toCharFormat((QTextFormat *)local_58);
      QTextFormat::~QTextFormat((QTextFormat *)&stack0xffffffffffffffb8);
      iVar6 = QTextFormat::intProperty((QTextFormat *)local_58,0x4810);
      iVar6 = iVar6 + (uint)(iVar6 == 0);
      iVar7 = QTextFormat::intProperty((QTextFormat *)local_58,0x4811);
      iVar7 = iVar7 + (uint)(iVar7 == 0);
      iVar1 = this->nCols;
      uVar8 = (long)this->nRows * (long)iVar1;
      if ((int)uVar17 < (int)uVar8) {
        piVar3 = (this->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = (ulong)(int)uVar17;
        do {
          if ((ulong)((long)(this->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar3 >> 2) <= uVar17)
          goto LAB_0052ca9d;
          if (piVar3[uVar17] == 0) goto LAB_0052c999;
          uVar17 = uVar17 + 1;
        } while (uVar8 - uVar17 != 0);
        uVar17 = uVar8 & 0xffffffff;
      }
LAB_0052c999:
      uVar8 = (ulong)(uint)((int)uVar17 >> 0x1f) << 0x20 | uVar17 & 0xffffffff;
      uVar13 = (long)uVar8 / (long)iVar1;
      uVar12 = uVar13 & 0xffffffff;
      piVar9 = QList<int>::data(&this->cellIndices);
      piVar9[uVar16] = (int)uVar17;
      iVar10 = iVar6 + (int)uVar13;
      if (this->nRows < iVar10) {
        local_48 = 0;
        std::vector<int,_std::allocator<int>_>::resize
                  (&this->grid,(long)iVar10 * (long)this->nCols,&stack0xffffffffffffffb8);
        this->nRows = iVar10;
      }
      if (0 < iVar6) {
        piVar3 = (this->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->grid).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        iVar10 = 0;
        do {
          uVar13 = (long)uVar8 % (long)iVar1 & 0xffffffff;
          iVar14 = iVar7;
          if (0 < iVar7) {
            do {
              uVar15 = (ulong)(this->nCols * (int)uVar12 + (int)uVar13);
              if ((ulong)((long)piVar4 - (long)piVar3 >> 2) <= uVar15) {
                update();
                goto LAB_0052ca9d;
              }
              piVar3[uVar15] = iVar5;
              uVar13 = (ulong)((int)uVar13 + 1);
              iVar14 = iVar14 + -1;
            } while (iVar14 != 0);
          }
          iVar10 = iVar10 + 1;
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (iVar10 != iVar6);
      }
      QTextFormat::~QTextFormat((QTextFormat *)local_58);
      uVar16 = uVar16 + 1;
    } while (uVar16 < (ulong)(this->cells).d.size);
  }
  this->dirty = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0052caa2:
  __stack_chk_fail();
LAB_0052ca9d:
  update();
  goto LAB_0052caa2;
}

Assistant:

void QTextTablePrivate::update() const
{
    Q_Q(const QTextTable);
    nCols = q->format().columns();
    nRows = (cells.size() + nCols-1)/nCols;
//     qDebug(">>>> QTextTablePrivate::update, nRows=%d, nCols=%d", nRows, nCols);

    grid.assign(nRows * nCols, 0);

    QTextDocumentPrivate *p = pieceTable;
    QTextFormatCollection *c = p->formatCollection();

    cellIndices.resize(cells.size());

    int cell = 0;
    for (int i = 0; i < cells.size(); ++i) {
        int fragment = cells.at(i);
        QTextCharFormat fmt = c->charFormat(QTextDocumentPrivate::FragmentIterator(&p->fragmentMap(), fragment)->format);
        int rowspan = fmt.tableCellRowSpan();
        int colspan = fmt.tableCellColumnSpan();

        // skip taken cells
        while (cell < nRows*nCols && grid[cell])
            ++cell;

        int r = cell/nCols;
        int c = cell%nCols;
        cellIndices[i] = cell;

        if (r + rowspan > nRows) {
            grid.resize((r + rowspan) * nCols, 0);
            nRows = r + rowspan;
        }

        Q_ASSERT(c + colspan <= nCols);
        for (int ii = 0; ii < rowspan; ++ii) {
            for (int jj = 0; jj < colspan; ++jj) {
                Q_ASSERT(grid[(r+ii)*nCols + c+jj] == 0);
                grid[(r+ii)*nCols + c+jj] = fragment;
//              qDebug("    setting cell %d span=%d/%d at %d/%d", fragment, rowspan, colspan, r+ii, c+jj);
            }
        }
    }
//     qDebug("<<<< end: nRows=%d, nCols=%d", nRows, nCols);

    dirty = false;
}